

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oaa.cc
# Opt level: O3

void learn_randomized(oaa *o,single_learner *base,example *ec)

{
  uint64_t *puVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  uint32_t uVar5;
  ostream *poVar6;
  uint64_t uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint32_t uVar11;
  ulong uVar12;
  uint uVar13;
  float fVar14;
  
  uVar4 = (ec->l).multi.label;
  uVar10 = (ulong)uVar4;
  fVar2 = (ec->l).simple.weight;
  if ((uVar10 == 0) || ((uVar4 != 0xffffffff && (o->k < uVar10)))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"label ",6);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," is not in {1,",0xe);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"} This won\'t work right.",0x18);
    std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
  }
  (ec->l).multi.label = 0x3f800000;
  *(undefined8 *)((long)&(ec->l).cs.costs._begin + 4) = 0;
  uVar11 = uVar4 - 1;
  puVar1 = &(ec->super_example_predict).ft_offset;
  *puVar1 = *puVar1 + (ulong)(*(int *)(base + 0xe0) * uVar11);
  (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
  uVar7 = (ec->super_example_predict).ft_offset - (ulong)(*(int *)(base + 0xe0) * uVar11);
  (ec->super_example_predict).ft_offset = uVar7;
  fVar14 = ec->partial_prediction;
  (ec->l).multi.label = 0xbf800000;
  fVar3 = ec->weight;
  ec->weight = ((float)o->k / (float)o->num_subsample) * fVar3;
  uVar9 = o->num_subsample;
  uVar8 = o->subsample_id;
  uVar13 = uVar4;
  if (uVar9 != 0) {
    uVar12 = 0;
    do {
      uVar5 = o->subsample_order[uVar8];
      uVar8 = (uVar8 + 1) % o->k;
      if (uVar5 != uVar11) {
        (ec->super_example_predict).ft_offset = *(int *)(base + 0xe0) * uVar5 + uVar7;
        (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
        uVar7 = (ec->super_example_predict).ft_offset - (ulong)(*(int *)(base + 0xe0) * uVar5);
        (ec->super_example_predict).ft_offset = uVar7;
        if (fVar14 < ec->partial_prediction) {
          uVar10 = (ulong)(uVar5 + 1);
          fVar14 = ec->partial_prediction;
        }
        uVar12 = uVar12 + 1;
        uVar9 = o->num_subsample;
      }
      uVar13 = (uint)uVar10;
    } while (uVar12 < uVar9);
  }
  o->subsample_id = uVar8;
  (ec->pred).multiclass = uVar13;
  (ec->l).multi.label = uVar4;
  (ec->l).simple.weight = fVar2;
  ec->weight = fVar3;
  return;
}

Assistant:

void learn_randomized(oaa& o, LEARNER::single_learner& base, example& ec)
{
  MULTICLASS::label_t ld = ec.l.multi;
  if (ld.label == 0 || (ld.label > o.k && ld.label != (uint32_t)-1))
    cout << "label " << ld.label << " is not in {1," << o.k << "} This won't work right." << endl;

  ec.l.simple = {1., 0.f, 0.f};  // truth
  base.learn(ec, ld.label - 1);

  size_t prediction = ld.label;
  float best_partial_prediction = ec.partial_prediction;

  ec.l.simple.label = -1.;
  float weight_temp = ec.weight;
  ec.weight *= ((float)o.k) / (float)o.num_subsample;
  size_t p = o.subsample_id;
  size_t count = 0;
  while (count < o.num_subsample)
  {
    uint32_t l = o.subsample_order[p];
    p = (p + 1) % o.k;
    if (l == ld.label - 1)
      continue;
    base.learn(ec, l);
    if (ec.partial_prediction > best_partial_prediction)
    {
      best_partial_prediction = ec.partial_prediction;
      prediction = l + 1;
    }
    count++;
  }
  o.subsample_id = p;

  ec.pred.multiclass = (uint32_t)prediction;
  ec.l.multi = ld;
  ec.weight = weight_temp;
}